

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O2

void __thiscall
gimage::ImageIO::load(ImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  size_t sVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  long k;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  iterator iVar10;
  BasicImageIO *pBVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  size_t sVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  size_t __n;
  float *pfVar22;
  long lVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  int depth;
  uint local_26c;
  long local_268;
  long local_260;
  float *local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  char *local_230;
  long local_228;
  long local_220;
  long local_218;
  long theight;
  long twidth;
  BasicImageIO *local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long tborder;
  long local_1d8;
  long local_1d0;
  valarray<float> value;
  valarray<float> count;
  string tname;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> timage;
  long height;
  long width;
  string s_1;
  string suffix;
  string prefix;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string s;
  
  local_26c = ds;
  local_268 = x;
  local_248 = y;
  local_230 = name;
  std::__cxx11::string::string((string *)&s,name,(allocator *)&timage);
  uVar5 = std::__cxx11::string::rfind((char)&s,0x3a);
  if (uVar5 != 0xffffffffffffffff) {
    iVar4 = std::__cxx11::string::compare((ulong)&s,uVar5,(char *)0x2);
    pcVar3 = local_230;
    if (iVar4 != 0) {
      local_200 = getBasicImageIO(this,local_230,true);
      std::__cxx11::string::string((string *)&s_1,pcVar3,(allocator *)&timage);
      uVar5 = std::__cxx11::string::rfind((char)&s_1,0x3a);
      if (uVar5 != 0xffffffffffffffff) {
        std::__cxx11::string::compare((ulong)&s_1,uVar5,(char *)0x2);
      }
      std::__cxx11::string::substr((ulong)&prefix,(ulong)&s_1);
      std::__cxx11::string::substr((ulong)&suffix,(ulong)&s_1);
      list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &list._M_t._M_impl.super__Rb_tree_header._M_header;
      list._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      anon_unknown_17::loadTiledHeader
                (local_200,&list,&prefix,&suffix,&twidth,&theight,&tborder,&width,&height,&depth);
      lVar18 = tborder;
      local_260 = (long)(int)local_26c;
      if (w < 1) {
        w = (width + local_260 + -1) / local_260;
      }
      if (h < 1) {
        h = (height + local_260 + -1) / local_260;
      }
      local_1f8 = twidth + tborder * -2;
      local_220 = theight + tborder * -2;
      if (tborder == 0 && local_26c == 1) {
        Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(image,w,h,(long)depth);
        lVar18 = local_1f8;
        local_240 = w + local_268;
        local_228 = h + local_248;
        lVar6 = (local_228 + -1) / local_220;
        lVar7 = (local_240 + -1) / local_1f8;
        lVar8 = 0;
        if (0 < local_268) {
          lVar8 = local_268;
        }
        lVar8 = lVar8 / local_1f8;
        lVar9 = 0;
        if (0 < local_248) {
          lVar9 = local_248;
        }
        lVar9 = lVar9 / local_220;
        sVar1 = image->n;
        sVar17 = -sVar1;
        if (0 < (long)sVar1) {
          sVar17 = sVar1;
        }
        memset(image->pixel,0,sVar17);
        local_1f0 = (long)(int)lVar8;
        local_238 = (long)(int)lVar7;
        local_218 = (long)(int)lVar6;
        lVar6 = (long)(int)lVar9;
        lVar8 = local_240;
        while (lVar7 = local_248, lVar6 <= local_218) {
          local_258 = (float *)(local_248 - lVar6 * local_220);
          if ((long)local_258 < 1) {
            local_258 = (float *)0x0;
          }
          pfVar22 = (float *)(lVar6 * local_220 + (long)local_258);
          local_260 = local_228 - (long)pfVar22;
          lVar9 = local_1f0;
          local_1e8 = lVar6;
          while (lVar9 <= local_238) {
            lVar6 = local_268 - lVar9 * lVar18;
            if (lVar6 < 1) {
              lVar6 = 0;
            }
            lVar18 = lVar9 * lVar18 + lVar6;
            lVar8 = lVar8 - lVar18;
            if (twidth - lVar6 <= lVar8) {
              lVar8 = twidth - lVar6;
            }
            lVar20 = theight - (long)local_258;
            if (local_260 < theight - (long)local_258) {
              lVar20 = local_260;
            }
            local_250 = lVar9;
            anon_unknown_17::getTileName(&tname,&prefix,(int)local_1e8,(int)lVar9,&suffix);
            Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
                      (&timage,lVar8,lVar20,depth);
            iVar10 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&list._M_t,&tname);
            if ((_Rb_tree_header *)iVar10._M_node != &list._M_t._M_impl.super__Rb_tree_header) {
              (*local_200->_vptr_BasicImageIO[6])
                        (local_200,&timage,tname._M_dataplus._M_p,1,lVar6,local_258,lVar8,lVar20);
              for (lVar8 = 0; lVar8 < timage.height; lVar8 = lVar8 + 1) {
                for (lVar6 = 0; lVar6 < timage.width; lVar6 = lVar6 + 1) {
                  for (lVar9 = 0; lVar9 < depth; lVar9 = lVar9 + 1) {
                    image->img[lVar9][(long)pfVar22 + (lVar8 - lVar7)][lVar6 + (lVar18 - local_268)]
                         = timage.img[lVar9][lVar8][lVar6];
                  }
                }
              }
            }
            Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&timage);
            std::__cxx11::string::~string((string *)&tname);
            lVar18 = local_1f8;
            lVar8 = local_240;
            lVar9 = local_250 + 1;
          }
          lVar6 = local_1e8 + 1;
        }
      }
      else {
        local_1d0 = local_260 * local_268;
        local_250 = 0;
        if (0 < local_1d0 - tborder) {
          local_250 = local_1d0 - tborder;
        }
        local_250 = local_250 / local_1f8;
        lVar6 = ((w + local_268 + -1) * local_260 + tborder) / local_1f8;
        lVar7 = ((local_248 + h + -1) * local_260 + tborder) / local_220;
        __n = h * w;
        local_228 = h;
        std::valarray<float>::valarray(&value,(long)depth * __n);
        std::valarray<float>::valarray(&count,__n);
        local_1d8 = local_260 * local_248;
        lVar8 = local_1d8 - lVar18;
        if (local_1d8 - lVar18 < 1) {
          lVar8 = 0;
        }
        lVar20 = (w + local_268) * local_260;
        lVar21 = (local_228 + local_248) * local_260;
        lVar9 = (long)(int)local_250;
        local_238 = w * 4;
        lVar18 = local_220;
        for (lVar8 = (long)(int)(lVar8 / local_220); lVar16 = local_228, lVar8 <= (int)lVar7;
            lVar8 = lVar8 + 1) {
          lVar12 = lVar8 * lVar18;
          lVar13 = lVar12 - local_1d8;
          for (lVar16 = lVar9; lVar16 <= (int)lVar6; lVar16 = lVar16 + 1) {
            local_218 = lVar16 * local_1f8;
            local_240 = (tborder - local_218) + local_1d0;
            if (local_240 < 1) {
              local_240 = 0;
            }
            lVar19 = tborder - lVar12;
            lVar18 = local_1d8 + lVar19;
            if (lVar18 < 1) {
              lVar18 = 0;
            }
            pfVar22 = (float *)(((tborder - local_218) + lVar20) - local_240);
            if (twidth - local_240 <= (long)pfVar22) {
              pfVar22 = (float *)(twidth - local_240);
            }
            lVar19 = (lVar19 + lVar21) - lVar18;
            if (theight - lVar18 <= lVar19) {
              lVar19 = theight - lVar18;
            }
            anon_unknown_17::getTileName(&tname,&prefix,(int)lVar8,(int)lVar16,&suffix);
            local_258 = pfVar22;
            local_250 = lVar19;
            Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
                      (&timage,(long)pfVar22,lVar19,depth);
            iVar10 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&list._M_t,&tname);
            lVar19 = local_240;
            if ((_Rb_tree_header *)iVar10._M_node != &list._M_t._M_impl.super__Rb_tree_header) {
              (*local_200->_vptr_BasicImageIO[6])
                        (local_200,&timage,tname._M_dataplus._M_p,1,local_240,lVar18,local_258,
                         local_250);
              local_250 = timage.width;
              if (timage.width < 1) {
                local_250 = 0;
              }
              local_1f0 = timage.height;
              if (timage.height < 1) {
                local_1f0 = 0;
              }
              local_218 = local_218 + lVar19;
              for (lVar19 = 0; lVar19 != local_1f0; lVar19 = lVar19 + 1) {
                local_258 = count._M_data;
                fVar24 = (float)tborder + (float)tborder;
                local_1e8 = twidth;
                fVar26 = (float)(lVar19 + lVar18) / fVar24;
                fVar25 = (float)(theight - (lVar19 + lVar18)) / fVar24;
                if (fVar26 <= fVar25) {
                  fVar25 = fVar26;
                }
                if (1.0 <= fVar25) {
                  fVar25 = 1.0;
                }
                if (fVar25 <= 1e-06) {
                  fVar25 = 1e-06;
                }
                uVar2 = depth;
                if (depth < 1) {
                  uVar2 = 0;
                }
                for (lVar23 = 0; lVar23 != local_250; lVar23 = lVar23 + 1) {
                  lVar14 = (lVar23 + (local_218 - (local_1d0 + tborder))) / local_260;
                  lVar15 = ((lVar13 + lVar18 + lVar19) - tborder) / local_260;
                  if (tborder < 1) {
                    pfVar22 = (float *)(local_238 * lVar15 + lVar14 * 4 + (long)value._M_data);
                    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
                      *pfVar22 = (float)timage.img[uVar5][lVar19][lVar23] + *pfVar22;
                      pfVar22 = pfVar22 + __n;
                    }
                    pfVar22 = count._M_data + lVar15 * w;
                    fVar26 = pfVar22[lVar14] + 1.0;
                  }
                  else {
                    fVar27 = (float)(local_240 + lVar23) / fVar24;
                    fVar26 = (float)(twidth - (local_240 + lVar23)) / fVar24;
                    if (fVar27 <= fVar26) {
                      fVar26 = fVar27;
                    }
                    if (1.0 <= fVar26) {
                      fVar26 = 1.0;
                    }
                    if (fVar26 <= 1e-06) {
                      fVar26 = 1e-06;
                    }
                    pfVar22 = (float *)(local_238 * lVar15 + lVar14 * 4 + (long)value._M_data);
                    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
                      *pfVar22 = (float)timage.img[uVar5][lVar19][lVar23] * fVar26 * fVar25 +
                                 *pfVar22;
                      pfVar22 = pfVar22 + __n;
                    }
                    pfVar22 = count._M_data + lVar15 * w;
                    fVar26 = fVar26 * fVar25 + pfVar22[lVar14];
                  }
                  pfVar22[lVar14] = fVar26;
                }
              }
            }
            Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&timage);
            std::__cxx11::string::~string((string *)&tname);
            lVar18 = local_220;
          }
        }
        Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
                  (image,w,local_228,(long)depth);
        sVar1 = image->n;
        sVar17 = -sVar1;
        if (0 < (long)sVar1) {
          sVar17 = sVar1;
        }
        lVar8 = 0;
        memset(image->pixel,0,sVar17);
        lVar18 = 0;
        if (0 < w) {
          lVar18 = w;
        }
        if (lVar16 < 1) {
          lVar16 = lVar8;
        }
        for (lVar6 = 0; lVar6 != lVar16; lVar6 = lVar6 + 1) {
          lVar7 = lVar8;
          for (lVar9 = 0; lVar9 != lVar18; lVar9 = lVar9 + 1) {
            fVar25 = count._M_data[lVar6 * w + lVar9];
            if (0.0 < fVar25) {
              lVar20 = lVar7;
              for (lVar21 = 0; lVar21 < depth; lVar21 = lVar21 + 1) {
                image->img[lVar21][lVar6][lVar9] =
                     (uchar)(int)(*(float *)((long)value._M_data + lVar20) / fVar25);
                lVar20 = lVar20 + __n * 4;
              }
            }
            lVar7 = lVar7 + 4;
          }
          lVar8 = lVar8 + local_238;
        }
        operator_delete(count._M_data);
        operator_delete(value._M_data);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&list._M_t);
      std::__cxx11::string::~string((string *)&suffix);
      std::__cxx11::string::~string((string *)&prefix);
      std::__cxx11::string::~string((string *)&s_1);
      goto LAB_001319c9;
    }
  }
  pBVar11 = getBasicImageIO(this,local_230,true);
  (*pBVar11->_vptr_BasicImageIO[6])
            (pBVar11,image,local_230,(ulong)local_26c,local_268,local_248,w,h);
LAB_001319c9:
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void ImageIO::load(ImageU8 &image, const char *name, int ds, long x, long y,
                   long w, long h) const
{
  std::string s=name;
  size_t pos=s.rfind(':');

  if (pos != s.npos && s.compare(pos, 2, ":\\") == 0)
  {
    pos=s.npos;
  }

  if (pos == s.npos)
  {
    getBasicImageIO(name, true).load(image, name, ds, x, y, w, h);
  }
  else
  {
    try
    {
      loadTiled(getBasicImageIO(name, true), image, name, ds, x, y, w, h);
    }
    catch (const std::exception &)
    {
      // if loading as tiled image fails, try loading as image with colon in file name
      getBasicImageIO(name, true).load(image, name, ds, x, y, w, h);
    }
  }
}